

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglpaintengine.cpp
# Opt level: O2

void __thiscall
QOpenGL2PaintEngineExPrivate::updateClipScissorTest(QOpenGL2PaintEngineExPrivate *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  long lVar3;
  undefined1 auVar4 [16];
  QRect QVar5;
  long lVar6;
  int extraout_EDX;
  int extraout_EDX_00;
  undefined8 uVar7;
  int extraout_var;
  int extraout_var_00;
  uint uVar8;
  Representation RVar9;
  undefined8 uVar10;
  long in_FS_OFFSET;
  QRect local_38;
  QRect local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = *(long *)&this->field_0x10;
  lVar6 = *(long *)(lVar3 + 8) + -8;
  if (*(long *)(lVar3 + 8) == 0) {
    lVar6 = 0;
  }
  if ((*(byte *)(lVar6 + 0x1c0) & 4) == 0) {
    (**(code **)(*(long *)&this->funcs + 0x70))();
    lVar6 = *(long *)&this->funcs;
    uVar10 = 0x207;
    uVar8 = 0;
    uVar7 = 0xff;
  }
  else {
    (**(code **)(*(long *)&this->funcs + 0x88))(0xb90);
    lVar6 = *(long *)(lVar3 + 8) + -8;
    if (*(long *)(lVar3 + 8) == 0) {
      lVar6 = 0;
    }
    uVar8 = *(uint *)(lVar6 + 0x1c0) >> 9 & 0xff;
    lVar6 = *(long *)&this->funcs;
    uVar10 = 0x203;
    uVar7 = 0xffffff7f;
  }
  (**(code **)(lVar6 + 0x128))(uVar10,uVar8,uVar7);
  QVar5.x2.m_i = local_38.x2.m_i;
  QVar5.y2.m_i = local_38.y2.m_i;
  QVar5.x1.m_i = local_38.x1.m_i;
  QVar5.y1.m_i = local_38.y1.m_i;
  lVar6 = *(long *)(lVar3 + 8) + -8;
  if (*(long *)(lVar3 + 8) == 0) {
    lVar6 = 0;
  }
  local_28._0_8_ = *(undefined8 *)(lVar6 + 0x1c4);
  local_28._8_8_ = *(undefined8 *)(lVar6 + 0x1cc);
  if ((*(byte *)(lVar6 + 0x1a0) & 4) == 0) {
    if (this->useSystemClip == false) {
      local_28.x2.m_i = this->width + -1;
      local_28.y2.m_i = this->height + -1;
      local_28.x1.m_i = 0;
      local_28.y1.m_i = 0;
      RVar9.m_i = 0;
      goto LAB_00140b90;
    }
    local_28._0_8_ = QRegion::boundingRect();
    local_28.x2.m_i = extraout_EDX;
    local_28.y2.m_i = extraout_var;
  }
  else {
    if (this->useSystemClip == false) {
      uVar1 = this->width;
      uVar2 = this->height;
      auVar4._4_4_ = uVar2 + -1;
      auVar4._0_4_ = uVar1 + -1;
      auVar4._8_8_ = 0;
      local_38 = (QRect)(auVar4 << 0x40);
    }
    else {
      local_38 = (QRect)QRegion::boundingRect();
    }
    local_28._0_8_ = QRect::operator&(&local_28,&local_38);
    local_28.x2.m_i = extraout_EDX_00;
    local_28.y2.m_i = extraout_var_00;
  }
  RVar9.m_i = local_28.y1.m_i;
  QVar5 = local_38;
LAB_00140b90:
  (this->currentScissorBounds).x1 = (Representation)local_28.x1.m_i;
  (this->currentScissorBounds).y1 = (Representation)local_28.y1.m_i;
  (this->currentScissorBounds).x2.m_i = local_28.x2.m_i;
  (this->currentScissorBounds).y2.m_i = local_28.y2.m_i;
  local_38 = QVar5;
  if ((((local_28.x1.m_i == 0) && (local_28.x2.m_i == this->width + -1)) && (RVar9.m_i == 0)) &&
     (local_28.y2.m_i == this->height + -1)) {
    (**(code **)(*(long *)&this->funcs + 0x70))(0xc11);
  }
  else {
    (**(code **)(*(long *)&this->funcs + 0x88))(0xc11);
    setScissor(this,&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGL2PaintEngineExPrivate::updateClipScissorTest()
{
    Q_Q(QOpenGL2PaintEngineEx);
    if (q->state()->clipTestEnabled) {
#ifndef QT_NO_DEBUG
        if (ctx->format().stencilBufferSize() <= 0)
            qWarning("OpenGL paint engine: attempted to use stencil test for clipping without requesting a stencil buffer.");
#endif
        funcs.glEnable(GL_STENCIL_TEST);
        funcs.glStencilFunc(GL_LEQUAL, q->state()->currentClip, ~GL_STENCIL_HIGH_BIT);
    } else {
        funcs.glDisable(GL_STENCIL_TEST);
        funcs.glStencilFunc(GL_ALWAYS, 0, 0xff);
    }

#ifdef QT_GL_NO_SCISSOR_TEST
    currentScissorBounds = QRect(0, 0, width, height);
#else
    QRect bounds = q->state()->rectangleClip;
    if (!q->state()->clipEnabled) {
        if (useSystemClip)
            bounds = systemClip.boundingRect();
        else
            bounds = QRect(0, 0, width, height);
    } else {
        if (useSystemClip)
            bounds = bounds.intersected(systemClip.boundingRect());
        else
            bounds = bounds.intersected(QRect(0, 0, width, height));
    }

    currentScissorBounds = bounds;

    if (bounds == QRect(0, 0, width, height)) {
        funcs.glDisable(GL_SCISSOR_TEST);
    } else {
        funcs.glEnable(GL_SCISSOR_TEST);
        setScissor(bounds);
    }
#endif
}